

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccgen.c
# Opt level: O2

Sym * sym_push2(Sym **ps,int v,int t,int c)

{
  Sym *pSVar1;
  void *data;
  long lVar2;
  
  pSVar1 = sym_free_first;
  if (sym_free_first == (Sym *)0x0) {
    data = tcc_malloc(0x1ff0);
    dynarray_add(&sym_pools,&nb_sym_pools,data);
    for (lVar2 = 0; pSVar1 = sym_free_first, (int)lVar2 != 0x1ff0; lVar2 = lVar2 + 0x38) {
      *(Sym **)((long)data + lVar2 + 0x20) = sym_free_first;
      sym_free_first = (Sym *)(lVar2 + (long)data);
    }
  }
  sym_free_first = (pSVar1->field_5).next;
  pSVar1->v = 0;
  pSVar1->r = 0;
  pSVar1->a = (SymAttr)0x0;
  (pSVar1->field_3).enum_val = 0;
  *(undefined8 *)&pSVar1->type = 0;
  (pSVar1->type).ref = (Sym *)0x0;
  pSVar1->prev_tok = (Sym *)0x0;
  (pSVar1->field_5).next = (Sym *)0x0;
  pSVar1->prev = (Sym *)0x0;
  pSVar1->v = v;
  (pSVar1->type).t = t;
  (pSVar1->field_3).field_0.c = c;
  pSVar1->prev = *ps;
  *ps = pSVar1;
  return pSVar1;
}

Assistant:

ST_FUNC Sym* sym_push2(Sym** ps, int v, int t, int c) {
  Sym* s;

  s = sym_malloc();
  memset(s, 0, sizeof *s);
  s->v = v;
  s->type.t = t;
  s->c = c;
  /* add in stack */
  s->prev = *ps;
  *ps = s;
  return s;
}